

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS ref_facelift_free(REF_FACELIFT ref_facelift)

{
  long lVar1;
  
  if (ref_facelift != (REF_FACELIFT)0x0) {
    if (ref_facelift->edge_search != (REF_SEARCH *)0x0) {
      for (lVar1 = 0; lVar1 < ref_facelift->grid->geom->nedge; lVar1 = lVar1 + 1) {
        ref_search_free(ref_facelift->edge_search[lVar1]);
      }
      free(ref_facelift->edge_search);
    }
    if (ref_facelift->face_search != (REF_SEARCH *)0x0) {
      for (lVar1 = 0; lVar1 < ref_facelift->grid->geom->nface; lVar1 = lVar1 + 1) {
        ref_search_free(ref_facelift->face_search[lVar1]);
      }
      free(ref_facelift->face_search);
    }
    free(ref_facelift->strong_bc);
    free(ref_facelift->displacement);
    ref_grid_free(ref_facelift->grid);
    free(ref_facelift);
    return 0;
  }
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_free(REF_FACELIFT ref_facelift) {
  REF_INT i;
  if (NULL == (void *)ref_facelift) return REF_NULL;

  if (NULL != ref_facelift->edge_search) {
    for (i = 0; i < ref_facelift_geom(ref_facelift)->nedge; i++)
      ref_search_free(ref_facelift_edge_search(ref_facelift, i));
    ref_free(ref_facelift->edge_search);
  }
  if (NULL != ref_facelift->face_search) {
    for (i = 0; i < ref_facelift_geom(ref_facelift)->nface; i++)
      ref_search_free(ref_facelift_face_search(ref_facelift, i));
    ref_free(ref_facelift->face_search);
  }
  ref_free(ref_facelift->strong_bc);
  ref_free(ref_facelift->displacement);
  ref_grid_free(ref_facelift_grid(ref_facelift));
  /* geom is a pointer to the orig */
  ref_free(ref_facelift);

  return REF_SUCCESS;
}